

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

tmbstr get_escaped_name(ctmbstr name)

{
  code cVar1;
  char cVar2;
  char *__s;
  size_t sVar3;
  TidyOption topt;
  code *pcVar4;
  int iVar5;
  TidyDoc tdoc;
  int iVar6;
  TidyIterator p_Stack_e0;
  OptionDesc OStack_d8;
  ctmbstr ptStack_50;
  char aux [2];
  
  iVar5 = 0;
  pcVar4 = (code *)name;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == (code)0x22) {
      iVar6 = 6;
    }
    else {
      iVar6 = 4;
      if ((cVar1 != (code)0x3c) && (cVar1 != (code)0x3e)) {
        if (cVar1 == (code)0x0) break;
        iVar6 = 1;
      }
    }
    iVar5 = iVar5 + iVar6;
    pcVar4 = pcVar4 + 1;
  } while( true );
  tdoc = (TidyDoc)(ulong)(iVar5 + 1);
  __s = (char *)malloc((size_t)tdoc);
  if (__s == (char *)0x0) {
    outOfMemory();
    ptStack_50 = name;
    p_Stack_e0 = tidyGetOptionList(tdoc);
    while (p_Stack_e0 != (TidyIterator)0x0) {
      topt = tidyGetNextOption(tdoc,&p_Stack_e0);
      GetOption(tdoc,topt,&OStack_d8);
      (*pcVar4)(tdoc,topt,&OStack_d8);
    }
    return (tmbstr)0x0;
  }
  *__s = '\0';
  aux[1] = '\0';
  do {
    cVar2 = *name;
    if (cVar2 == '\"') {
      sVar3 = strlen(__s);
      builtin_strncpy(__s + sVar3,"&quot;",7);
    }
    else {
      if (cVar2 == '<') {
        sVar3 = strlen(__s);
        builtin_strncpy(__s + sVar3,"&lt;",4);
      }
      else {
        if (cVar2 != '>') {
          if (cVar2 == '\0') {
            return __s;
          }
          aux[0] = cVar2;
          strcat(__s,aux);
          goto LAB_0013231e;
        }
        sVar3 = strlen(__s);
        builtin_strncpy(__s + sVar3,"&gt;",4);
      }
      __s[sVar3 + 4] = '\0';
    }
LAB_0013231e:
    name = name + 1;
  } while( true );
}

Assistant:

static tmbstr get_escaped_name( ctmbstr name )
{
    tmbstr escpName;
    char aux[2];
    uint len = 0;
    ctmbstr c;
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
        case '>':
            len += 4;
            break;
        case '"':
            len += 6;
            break;
        default:
            len += 1;
            break;
    }

    escpName = (tmbstr)malloc(len+1);
    if (!escpName) outOfMemory();
    escpName[0] = '\0';

    aux[1] = '\0';
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
            strcat(escpName, "&lt;");
            break;
        case '>':
            strcat(escpName, "&gt;");
            break;
        case '"':
            strcat(escpName, "&quot;");
            break;
        default:
            aux[0] = *c;
            strcat(escpName, aux);
            break;
    }

    return escpName;
}